

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl4cShaderSubroutineTests.cpp
# Opt level: O0

bool __thiscall gl4cts::ShaderSubroutine::Utils::program::isProgramBinarySupported(program *this)

{
  bool bVar1;
  int iVar2;
  deUint32 err;
  RenderContext *pRVar3;
  undefined4 extraout_var;
  ContextInfo *this_00;
  Functions *gl;
  program *ppStack_10;
  GLint n_program_binary_formats;
  program *this_local;
  
  gl._4_4_ = 0;
  ppStack_10 = this;
  pRVar3 = deqp::Context::getRenderContext(this->m_context);
  iVar2 = (*pRVar3->_vptr_RenderContext[3])();
  this_00 = deqp::Context::getContextInfo(this->m_context);
  bVar1 = glu::ContextInfo::isExtensionSupported(this_00,"GL_ARB_get_program_binary");
  if (bVar1) {
    (**(code **)(CONCAT44(extraout_var,iVar2) + 0x868))(0x87fe,(long)&gl + 4);
    err = (**(code **)(CONCAT44(extraout_var,iVar2) + 0x800))();
    glu::checkError(err,"glGetIntegerv() call failed.",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cShaderSubroutineTests.cpp"
                    ,0x185);
  }
  return 0 < gl._4_4_;
}

Assistant:

bool Utils::program::isProgramBinarySupported() const
{
	glw::GLint n_program_binary_formats = 0;

	const glw::Functions& gl = m_context.getRenderContext().getFunctions();

	if (m_context.getContextInfo().isExtensionSupported("GL_ARB_get_program_binary"))
	{
		gl.getIntegerv(GL_NUM_PROGRAM_BINARY_FORMATS, &n_program_binary_formats);
		GLU_EXPECT_NO_ERROR(gl.getError(), "glGetIntegerv() call failed.");
	}

	return n_program_binary_formats > 0;
}